

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BindingRenderCase::init
          (BindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderTarget *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  long *plVar3;
  TestError *this_01;
  size_type *psVar4;
  string local_f0;
  int local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (0x3f < pRVar2->m_width) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (0x3f < pRVar2->m_height) {
      iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x708))(1,&this->m_vao);
      iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      iVar1 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
      if (iVar1 == 0) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
        iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
        return iVar1;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"could not gen vao","");
      tcu::TestError::TestError(this_01,&local_f0);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_d0[1] = 0x40;
  de::toString<int>(&local_a8,local_d0 + 1);
  std::operator+(&local_68,"Test requires at least ",&local_a8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_c8._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar4) {
    local_c8.field_2._M_allocated_capacity = *psVar4;
    local_c8.field_2._8_8_ = plVar3[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar4;
  }
  local_c8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_d0[0] = 0x40;
  de::toString<int>(&local_88,local_d0);
  std::operator+(&local_48,&local_c8,&local_88);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_f0._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar4) {
    local_f0.field_2._M_allocated_capacity = *psVar4;
    local_f0.field_2._8_8_ = plVar3[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar4;
  }
  local_f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(this_00,&local_f0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BindingRenderCase::init (void)
{
	// check requirements
	if (m_context.getRenderTarget().getWidth() < TEST_RENDER_SIZE || m_context.getRenderTarget().getHeight() < TEST_RENDER_SIZE)
		throw tcu::NotSupportedError("Test requires at least " + de::toString<int>(TEST_RENDER_SIZE) + "x" + de::toString<int>(TEST_RENDER_SIZE) + " render target");

	// resources
	m_context.getRenderContext().getFunctions().genVertexArrays(1, &m_vao);
	if (m_context.getRenderContext().getFunctions().getError() != GL_NO_ERROR)
		throw tcu::TestError("could not gen vao");

	createBuffers();
	createShader();
}